

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# super_simple_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  uint in_EAX;
  ostream *poVar2;
  char *pcVar3;
  int i;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::spawn<void(int&),int&>(f,(int *)((long)&uStack_18 + 4));
  spin_mutex_t::lock(&my_io_mutex);
  poVar2 = std::operator<<((ostream *)&std::cerr,"post-spawn");
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  depspawn::wait_for_all();
  poVar2 = std::operator<<((ostream *)&std::cout,"Final i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uStack_18._4_4_);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = uStack_18._4_4_;
  poVar2 = std::operator<<((ostream *)&std::cout,"TEST ");
  pcVar3 = "SUCCESSFUL";
  if (iVar1 != 10) {
    pcVar3 = "UNSUCCESSFUL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return (int)(iVar1 != 10);
}

Assistant:

int main()
{ int i = 0;

  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(f, i);
  
  LOG("post-spawn");
  
  wait_for_all();

  std::cout << "Final i=" << i << std::endl;

  const bool test_ok = (i == 10);
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}